

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::ASL_AB(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  
  this->cycles = 6;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uint)(byte)uVar2);
  this->cycles = this->cycles - 1;
  bVar1 = (byte)iVar3 * '\x02';
  (this->field_6).ps =
       bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7c | (byte)iVar3 >> 7;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uint)(byte)uVar2,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::ASL_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}